

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

string * embree::removeQuotes(string *str)

{
  byte bVar1;
  bool bVar2;
  string *in_RSI;
  string *in_RDI;
  string *res;
  string *in_stack_ffffffffffffff20;
  allocator *paVar3;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  string local_b8 [8];
  string *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  allocator local_91;
  string local_90 [32];
  string local_70 [55];
  allocator local_39;
  string local_38 [39];
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"\"",&local_39);
  bVar1 = startsWith((string *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                     in_stack_ffffffffffffff20);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if ((bVar1 & 1) != 0) {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_70,(ulong)in_RDI);
    std::__cxx11::string::operator=((string *)in_RDI,local_70);
    std::__cxx11::string::~string(local_70);
  }
  paVar3 = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"\"",paVar3);
  bVar2 = endsWith(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  if (bVar2) {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_b8,(ulong)in_RDI);
    std::__cxx11::string::operator=((string *)in_RDI,local_b8);
    std::__cxx11::string::~string(local_b8);
  }
  return in_RDI;
}

Assistant:

std::string removeQuotes(std::string const &str)
{
  std::string res = str;
  if (startsWith(res, "\""))
    res = res.substr(1, res.length());
  if (endsWith(res, "\""))
    res = res.substr(0, res.length() - 1);
  return res;
}